

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  ssize_t sVar1;
  void *__buf_00;
  
  std::istream::seekg(&this->stream_,(long)__buf * 0x10 + (this->data_begin_)._M_off,
                      (this->data_begin_)._M_state);
  check_stream(this,"seekg for vector read");
  sVar1 = read(this,__fd,__buf_00,__nbytes);
  return sVar1;
}

Assistant:

void read(std::vector<value_type>& vector, pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for vector read");
        read(vector);
    }